

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

QString * nameFilterForMime(QString *__return_storage_ptr__,QString *mimeType)

{
  char cVar1;
  long in_FS_OFFSET;
  QMimeType mime;
  QMimeDatabase db;
  QArrayData *local_b8;
  char16_t *pcStack_b0;
  qsizetype local_a8;
  QString local_98;
  undefined1 *local_78;
  undefined1 *local_70;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>,_char16_t>
  local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QMimeDatabase::QMimeDatabase((QMimeDatabase *)&local_70);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  QMimeDatabase::mimeTypeForName((QString *)&local_78);
  cVar1 = QMimeType::isValid();
  if (cVar1 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    cVar1 = QMimeType::isDefault();
    if (cVar1 == '\0') {
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QMimeType::globPatterns();
      local_b8 = (QArrayData *)CONCAT62(local_b8._2_6_,0x20);
      QtPrivate::QStringList_join
                ((QList_conflict *)&local_98,(QChar *)&local_68,(longlong)&local_b8);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_68);
      QMimeType::comment();
      local_68.a.a.a.d.size = local_a8;
      local_68.a.a.a.d.ptr = pcStack_b0;
      local_68.a.a.a.d.d = (Data *)local_b8;
      local_a8 = 0;
      local_b8 = (QArrayData *)0x0;
      pcStack_b0 = (char16_t *)0x0;
      local_68.a.a.b.m_size = 2;
      local_68.a.a.b.m_data = " (";
      local_68.b = L')';
      local_68.a.b = &local_98;
      QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>,_char16_t>
      ::convertTo<QString>(__return_storage_ptr__,&local_68);
      if (&(local_68.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_68.a.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b8,2,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      QMetaObject::tr((char *)__return_storage_ptr__,(char *)&QFileDialog::staticMetaObject,0x6f4e39
                     );
    }
  }
  QMimeType::~QMimeType((QMimeType *)&local_78);
  QMimeDatabase::~QMimeDatabase((QMimeDatabase *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString nameFilterForMime(const QString &mimeType)
{
    QMimeDatabase db;
    QMimeType mime(db.mimeTypeForName(mimeType));
    if (mime.isValid()) {
        if (mime.isDefault()) {
            return QFileDialog::tr("All files (*)");
        } else {
            const QString patterns = mime.globPatterns().join(u' ');
            return mime.comment() + " ("_L1 + patterns + u')';
        }
    }
    return QString();
}